

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::php::(anonymous_namespace)::PhpGetterTypeName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FieldDescriptor *field,
          Options *options)

{
  bool bVar1;
  Descriptor *desc;
  string *extraout_RAX;
  string *extraout_RAX_00;
  char *pcVar2;
  char *pcVar3;
  _anonymous_namespace_ *local_40;
  string local_38;
  
  if (*(once_flag **)(this + 0x18) != (once_flag *)0x0) {
    local_38._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
    local_40 = this;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(this + 0x18),(_func_void_FieldDescriptor_ptr **)&local_38,
               (FieldDescriptor **)&local_40);
  }
  if ((this[2] == (_anonymous_namespace_)0xb) &&
     (bVar1 = FieldDescriptor::is_map_message_type((FieldDescriptor *)this), bVar1)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "\\Google\\Protobuf\\Internal\\MapField";
    pcVar2 = "";
  }
  else if ((~(byte)this[1] & 0x60) == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "\\Google\\Protobuf\\Internal\\RepeatedField";
    pcVar2 = "";
  }
  else {
    if (*(once_flag **)(this + 0x18) != (once_flag *)0x0) {
      local_38._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
      local_40 = this;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(this + 0x18),(_func_void_FieldDescriptor_ptr **)&local_38,
                 (FieldDescriptor **)&local_40);
    }
    switch(this[2]) {
    case (_anonymous_namespace_)0x1:
    case (_anonymous_namespace_)0x2:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "float";
      pcVar2 = "";
      break;
    case (_anonymous_namespace_)0x3:
    case (_anonymous_namespace_)0x4:
    case (_anonymous_namespace_)0x6:
    case (_anonymous_namespace_)0x10:
    case (_anonymous_namespace_)0x12:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "int|string";
      pcVar2 = "";
      break;
    case (_anonymous_namespace_)0x5:
    case (_anonymous_namespace_)0x7:
    case (_anonymous_namespace_)0xd:
    case (_anonymous_namespace_)0xe:
    case (_anonymous_namespace_)0xf:
    case (_anonymous_namespace_)0x11:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "int";
      pcVar2 = "";
      break;
    case (_anonymous_namespace_)0x8:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "bool";
      pcVar2 = "";
      break;
    case (_anonymous_namespace_)0x9:
    case (_anonymous_namespace_)0xc:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "string";
      pcVar2 = "";
      break;
    case (_anonymous_namespace_)0xa:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "null";
      pcVar2 = "";
      break;
    case (_anonymous_namespace_)0xb:
      desc = FieldDescriptor::message_type((FieldDescriptor *)this);
      anon_unknown_2::FullClassName<google::protobuf::Descriptor>(&local_38,desc,(Options *)field);
      std::operator+(__return_storage_ptr__,"\\",&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p == &local_38.field_2) {
        return (string *)&local_38.field_2;
      }
      operator_delete(local_38._M_dataplus._M_p);
      return extraout_RAX;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/php/php_generator.cc"
                    ,0x216,
                    "std::string google::protobuf::compiler::php::(anonymous namespace)::PhpGetterTypeName(const FieldDescriptor *, const Options &)"
                   );
    }
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return extraout_RAX_00;
}

Assistant:

std::string PhpGetterTypeName(const FieldDescriptor* field,
                              const Options& options) {
  if (field->is_map()) {
    return "\\Google\\Protobuf\\Internal\\MapField";
  }
  if (field->is_repeated()) {
    return "\\Google\\Protobuf\\Internal\\RepeatedField";
  }
  switch (field->type()) {
    case FieldDescriptor::TYPE_INT32:
    case FieldDescriptor::TYPE_UINT32:
    case FieldDescriptor::TYPE_SINT32:
    case FieldDescriptor::TYPE_FIXED32:
    case FieldDescriptor::TYPE_SFIXED32:
    case FieldDescriptor::TYPE_ENUM: return "int";
    case FieldDescriptor::TYPE_INT64:
    case FieldDescriptor::TYPE_UINT64:
    case FieldDescriptor::TYPE_SINT64:
    case FieldDescriptor::TYPE_FIXED64:
    case FieldDescriptor::TYPE_SFIXED64: return "int|string";
    case FieldDescriptor::TYPE_DOUBLE:
    case FieldDescriptor::TYPE_FLOAT: return "float";
    case FieldDescriptor::TYPE_BOOL: return "bool";
    case FieldDescriptor::TYPE_STRING:
    case FieldDescriptor::TYPE_BYTES: return "string";
    case FieldDescriptor::TYPE_MESSAGE:
      return "\\" + FullClassName(field->message_type(), options);
    case FieldDescriptor::TYPE_GROUP: return "null";
    default: assert(false); return "";
  }
}